

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

short tcu::anon_unknown_75::convertSatRte<short>(float f)

{
  short sVar1;
  short sVar2;
  long lVar3;
  float fVar4;
  undefined8 local_30;
  deInt64 intVal;
  float q;
  deInt64 maxVal;
  deInt64 minVal;
  float f_local;
  
  sVar1 = std::numeric_limits<short>::min();
  sVar2 = std::numeric_limits<short>::max();
  fVar4 = deFloatFrac(f);
  local_30 = (long)(f - fVar4);
  if ((fVar4 != 0.5) || (NAN(fVar4))) {
    if (0.5 < fVar4) {
      local_30 = local_30 + 1;
    }
  }
  else if (local_30 % 2 != 0) {
    local_30 = local_30 + 1;
  }
  lVar3 = de::min<long>((long)sVar2,local_30);
  lVar3 = de::max<long>((long)sVar1,lVar3);
  return (short)lVar3;
}

Assistant:

inline T convertSatRte (float f)
{
	// \note Doesn't work for 64-bit types
	DE_STATIC_ASSERT(sizeof(T) < sizeof(deUint64));
	DE_STATIC_ASSERT((-3 % 2 != 0) && (-4 % 2 == 0));

	deInt64	minVal	= std::numeric_limits<T>::min();
	deInt64 maxVal	= std::numeric_limits<T>::max();
	float	q		= deFloatFrac(f);
	deInt64 intVal	= (deInt64)(f-q);

	// Rounding.
	if (q == 0.5f)
	{
		if (intVal % 2 != 0)
			intVal++;
	}
	else if (q > 0.5f)
		intVal++;
	// else Don't add anything

	// Saturate.
	intVal = de::max(minVal, de::min(maxVal, intVal));

	return (T)intVal;
}